

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O3

void SimpleRecyclerTest(void)

{
  HeapAllocator *alloc;
  Recycler *this;
  _func_void *p_Var1;
  int iVar2;
  uint i;
  long lVar3;
  Location value;
  Location value_00;
  Location value_01;
  undefined1 local_3d8 [8];
  RecyclerTestObject *stackRoots [50];
  IdleDecommitPageAllocator pageAllocator;
  BackgroundPageQueue backgroundPageQueue;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  BuildObjectCreationTable();
  BuildOperationTable();
  pageAllocator.cs.super_CCLock.mutexPtr[0x38] = '\0';
  pageAllocator.cs.super_CCLock.mutexPtr[0x39] = '\0';
  pageAllocator.cs.super_CCLock.mutexPtr[0x3a] = '\0';
  pageAllocator.cs.super_CCLock.mutexPtr[0x3b] = '\0';
  pageAllocator.cs.super_CCLock.mutexPtr[0x3c] = '\0';
  pageAllocator.cs.super_CCLock.mutexPtr[0x3d] = '\0';
  pageAllocator.cs.super_CCLock.mutexPtr[0x3e] = '\0';
  pageAllocator.cs.super_CCLock.mutexPtr[0x3f] = '\0';
  backgroundPageQueue.bgFreePageList = (FreePageEntry *)0x0;
  CCLock::Reset((CCLock *)&backgroundPageQueue,true);
  backgroundPageQueue.backgroundPageQueueCriticalSection.super_CCLock.mutexPtr[0x38] = '\0';
  Memory::IdleDecommitPageAllocator::IdleDecommitPageAllocator
            ((IdleDecommitPageAllocator *)(stackRoots + 0x31),(AllocationPolicyManager *)0x0,
             PageAllocatorType_Thread,(ConfigFlagsTable *)Js::Configuration::Global,0,0x400,false,
             (BackgroundPageQueue *)(pageAllocator.cs.super_CCLock.mutexPtr + 0x38),0x20,false);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&backgroundPageQueue.field_0x4c,
             ExceptionType_DisableCheck);
  local_3d8 = (undefined1  [8])&Memory::Recycler::typeinfo;
  stackRoots[0] = (RecyclerTestObject *)0x0;
  stackRoots[1] = (RecyclerTestObject *)0xffffffffffffffff;
  stackRoots[2] = (RecyclerTestObject *)anon_var_dwarf_36ac;
  stackRoots[3]._0_4_ = 0x114;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_3d8);
  this = (Recycler *)new<Memory::HeapAllocator>(0x166e0,alloc,0x1bb8ee);
  Memory::Recycler::Recycler
            (this,(AllocationPolicyManager *)0x0,(IdleDecommitPageAllocator *)(stackRoots + 0x31),
             Js::Throw::OutOfMemory,(ConfigFlagsTable *)Js::Configuration::Global,
             (RecyclerTelemetryHostInterface *)0x0);
  recyclerInstance = this;
  Memory::Recycler::Initialize(this,false,(ThreadService *)0x0,false,PageHeapModeOff,false,false);
  PAL_wprintf(L"Recycler created, initializing heap...\n");
  lVar3 = 0;
  do {
    value.location = (undefined8 *)((long)stackRoots + lVar3 + -8);
    *value.location = 0;
    value._8_8_ = 0;
    WeightedTable<Location>::AddWeightedEntry(&roots,value,1);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 400);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)globalRoots + lVar3) = 0;
    value_00._8_8_ = 1;
    value_00.location = (RecyclerTestObject **)((long)globalRoots + lVar3);
    WeightedTable<Location>::AddWeightedEntry(&roots,value_00,1);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 400);
  if (implicitRootsMode == true) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)implicitRoots + lVar3) = 0;
      value_01._8_8_ = 4;
      value_01.location = (RecyclerTestObject **)((long)implicitRoots + lVar3);
      WeightedTable<Location>::AddWeightedEntry(&roots,value_01,1);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 400);
  }
  iVar2 = 10000;
  do {
    InsertObject();
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  PAL_wprintf(L"Initialization complete\n");
  WalkHeap();
  iVar2 = 0;
  do {
    do {
      p_Var1 = WeightedTable<void_(*)()>::GetRandomEntry(&operationTable);
      (*p_Var1)();
      iVar2 = iVar2 + 1;
    } while (iVar2 != 100000);
    WalkHeap();
    Memory::Recycler::FinishDisposeObjectsNow<(Memory::CollectionFlags)32768>(recyclerInstance);
    iVar2 = 0;
  } while( true );
}

Assistant:

void SimpleRecyclerTest()
{
    // Initialize the probability tables for object creation and heap operations.
    BuildObjectCreationTable();
    BuildOperationTable();

    // Construct Recycler instance and use it
#if ENABLE_BACKGROUND_PAGE_FREEING
    PageAllocator::BackgroundPageQueue backgroundPageQueue;
#endif
    IdleDecommitPageAllocator pageAllocator(nullptr, 
        PageAllocatorType::PageAllocatorType_Thread,
        Js::Configuration::Global.flags,
        0 /* maxFreePageCount */, PageAllocator::DefaultMaxFreePageCount /* maxIdleFreePageCount */,
        false /* zero pages */
#if ENABLE_BACKGROUND_PAGE_FREEING
        , &backgroundPageQueue
#endif
        );

    try
    {
#ifdef EXCEPTION_CHECK
        // REVIEW: Do we need a stack probe here? We don't care about OOM's since we deal with that below
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
#endif

        recyclerInstance = HeapNewZ(Recycler, nullptr, &pageAllocator, Js::Throw::OutOfMemory, Js::Configuration::Global.flags, nullptr);

        recyclerInstance->Initialize(false /* forceInThread */, nullptr /* threadService */);

#if FALSE
        // TODO: Support EnableImplicitRoots call on Recycler (or similar, e.g. constructor param)
        // Until then, implicitRootsMode support doesn't actually work.
        if (implicitRootsMode)
        {
            recycler->EnableImplicitRoots();
        }
#endif

        wprintf(_u("Recycler created, initializing heap...\n"));
        
        // Initialize stack roots and add to our roots table        
        RecyclerTestObject * stackRoots[stackRootCount];
        for (unsigned int i = 0; i < stackRootCount; i++)
        {
            stackRoots[i] = nullptr;
            roots.AddWeightedEntry(Location::Scanned(&stackRoots[i]), 1);
        }

        // Initialize global roots and add to our roots table        
        for (unsigned int i = 0; i < globalRootCount; i++)
        {
            globalRoots[i] = nullptr;
            roots.AddWeightedEntry(Location::Rooted(&globalRoots[i]), 1);
        }

        // MemProtect only:
        // Initialize implicit roots and add to our roots table        
        if (implicitRootsMode)
        {
            for (unsigned int i = 0; i < implicitRootCount; i++)
            {
                implicitRoots[i] = nullptr;
                roots.AddWeightedEntry(Location::ImplicitRoot(&implicitRoots[i]), 1);
            }
        }
        
        // Initialize GC heap randomly
        for (unsigned int i = 0; i < initializeCount; i++)
        {
            InsertObject();
        }

        wprintf(_u("Initialization complete\n"));

        // Do an initial walk
        WalkHeap();

        // Loop, continually doing heap operations, and periodically doing a full heap walk
        while (true)
        {
            for (unsigned int i = 0; i < operationsPerHeapWalk; i++)
            {
                DoHeapOperation();
            }
            
            WalkHeap();

            // Dispose now
            recyclerInstance->FinishDisposeObjectsNow<FinishDispose>();
        }
    }
    catch (Js::OutOfMemoryException)
    {
        printf("Error: OOM\n");
    }

    wprintf(_u("==== Test completed.\n"));
}